

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvastrscan.c
# Opt level: O2

int kill(__pid_t __pid,int __sig)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  
  nv50_graph_reset();
  pvVar1 = nva_cards[cnum]->bar0;
  if ((*(uint *)((long)pvVar1 + 0x40082c) >> 0xb & 1) == 0) {
    *(undefined4 *)((long)pvVar1 + 0x400824) = 0x4001;
    *(undefined4 *)((long)pvVar1 + 0x400828) = 1;
    *(undefined4 *)((long)pvVar1 + 0x40032c) = 0x4000;
    *(undefined4 *)((long)pvVar1 + 0x400784) = 0x4000;
    *(undefined4 *)((long)pvVar1 + 0x400320) = 4;
    *(undefined4 *)((long)pvVar1 + 0x400324) = 0;
    *(undefined4 *)((long)pvVar1 + 0x400328) = 0x200000;
    *(undefined4 *)((long)pvVar1 + 0x400328) = 0x600007;
    iVar2 = 1 << ((byte)__pid & 7);
    iVar3 = (__pid & 8U) * 0x10000;
    *(int *)((long)pvVar1 + 0x400328) = iVar3 + iVar2 + 0xc00000;
    *(undefined4 *)((long)pvVar1 + 0x400328) = 0x203000;
    *(int *)((long)pvVar1 + 0x400328) = iVar3 + 0x800000 + iVar2;
    *(undefined4 *)((long)pvVar1 + 0x400328) = 0x60000c;
    return (int)pvVar1;
  }
  puts("Aiiii, xfer is hung. bailing.");
  exit(1);
}

Assistant:

void kill(int j) {
	nv50_graph_reset();
	if (nva_rd32(cnum, 0x40082c) & 0x800) {
		printf("Aiiii, xfer is hung. bailing.\n");
		exit(1);
	}
	nva_wr32(cnum, 0x400824, FLAGS|1);
	nva_wr32(cnum, 0x400828, 1);
	nva_wr32(cnum, 0x40032c, 0x4000);
	nva_wr32(cnum, 0x400784, 0x4000);
	nva_wr32(cnum, 0x400320, 4);

	nva_wr32(cnum, 0x400324, 0);
	nva_wr32(cnum, 0x400328, 0x200000);
	nva_wr32(cnum, 0x400328, 0x600007);
	nva_wr32(cnum, 0x400328, 0xc00000 | (j&8)<<16 | 1<<(j&7));
	nva_wr32(cnum, 0x400328, 0x203000);
	nva_wr32(cnum, 0x400328, 0x800000 | (j&8)<<16 | 1<<(j&7));
	nva_wr32(cnum, 0x400328, 0x60000c);
}